

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O2

int __thiscall
Filter::searchRadius
          (Filter *this,TRIPLEYCbCr **mrx,TRIPLEYCbCr **mrxNoize,int min,int max,
          BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,char *filepath,double sigma)

{
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER BVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  int i;
  ulong uVar5;
  double dVar6;
  BITMAPFILEHEADER bmFile_00;
  string filename;
  string path;
  double local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  unsigned_short local_108;
  unsigned_short uStack_106;
  uint uStack_104;
  undefined1 local_100 [16];
  Filter *local_f0;
  TRIPLEYCbCr **local_e8;
  double local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TRIPLEBYTES **mrx2;
  
  BVar1 = bmInfo;
  local_100._8_8_ = mrx;
  local_f0 = this;
  local_e8 = mrxNoize;
  local_e0 = sigma;
  printf("Search radius(%s):\n",filepath);
  std::__cxx11::string::string((string *)&local_90,filepath,(allocator *)&local_128);
  std::operator+(&local_128,"mkdir -p ",&local_90);
  system(local_128._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_128);
  local_100._0_2_ = bmFile.bfType;
  local_100._2_2_ = bmFile._2_2_;
  local_100._4_4_ = bmFile.bfSize;
  local_108 = bmFile.bfReserved1;
  uStack_106 = bmFile.bfReserved2;
  uStack_104 = bmFile.bfOffBits;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)bmInfo.biHeight) {
    uVar4 = (ulong)bmInfo.biHeight;
  }
  local_140 = 0.0;
  for (; min < max; min = min + 1) {
    iVar2 = (**local_f0->_vptr_Filter)
                      (local_e0,local_f0,local_e8,(ulong)bmInfo.biHeight,(ulong)bmInfo.biWidth,
                       (ulong)(uint)min);
    mrx2 = (TRIPLEBYTES **)CONCAT44(extraout_var,iVar2);
    dVar6 = getPSNR((TRIPLEBYTES **)local_100._8_8_,mrx2,min,min,bmInfo.biHeight - min,
                    bmInfo.biWidth - min,0);
    if (local_140 < dVar6) {
      uVar3 = min;
    }
    printf("R = %3d\tPSNR[f,f] = %5.3f\n",(ulong)(uint)min);
    std::operator+(&local_128,&local_90,"/radius_");
    local_b8 = bmInfo.biClrUsed;
    uStack_b4 = bmInfo.biClrImportant;
    local_d8 = BVar1._0_8_;
    uStack_d0 = BVar1._8_8_;
    local_c8 = bmInfo.biCompression;
    uStack_c4 = bmInfo.biSizeImage;
    uStack_c0 = bmInfo.biXPelsPerMeter;
    uStack_bc = bmInfo.biYPelsPerMeter;
    std::__cxx11::to_string(&local_70,min);
    std::operator+(&local_50,&local_128,&local_70);
    std::operator+(&local_b0,&local_50,".bmp");
    bmInfo_00.biHeight = (undefined4)uStack_d0;
    bmInfo_00.biPlanes = uStack_d0._4_2_;
    bmInfo_00.biBitCount = uStack_d0._6_2_;
    bmInfo_00.biSize = (undefined4)local_d8;
    bmInfo_00.biWidth = local_d8._4_4_;
    bmInfo_00.biCompression = local_c8;
    bmInfo_00.biSizeImage = uStack_c4;
    bmInfo_00.biXPelsPerMeter = uStack_c0;
    bmInfo_00.biYPelsPerMeter = uStack_bc;
    bmInfo_00.biClrUsed = local_b8;
    bmInfo_00.biClrImportant = uStack_b4;
    bmFile_00.bfReserved1 = local_108;
    bmFile_00.bfReserved2 = uStack_106;
    bmFile_00.bfOffBits = uStack_104;
    bmFile_00.bfType = local_100._0_2_;
    bmFile_00._2_2_ = local_100._2_2_;
    bmFile_00.bfSize = local_100._4_4_;
    save_component_to_files(mrx2,bmFile_00,bmInfo_00,0,local_b0._M_dataplus._M_p);
    if (dVar6 <= local_140) {
      dVar6 = local_140;
    }
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (mrx2[uVar5] != (TRIPLEBYTES *)0x0) {
        operator_delete__(mrx2[uVar5]);
      }
    }
    if (mrx2 != (TRIPLEBYTES **)0x0) {
      operator_delete__(mrx2);
    }
    std::__cxx11::string::~string((string *)&local_128);
    local_140 = dVar6;
  }
  std::__cxx11::string::~string((string *)&local_90);
  return uVar3;
}

Assistant:

int Filter::searchRadius(TRIPLEYCbCr **mrx, TRIPLEYCbCr **mrxNoize, int min, int max, BITMAPFILEHEADER bmFile,
                         BITMAPINFOHEADER bmInfo, const char *filepath, double sigma) {
    printf("Search radius(%s):\n", filepath);
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    double maxPSNR = 0;
    int maxRadius = 0;
    double psnr;
    std::string path = filepath;
    system(("mkdir -p " + path).c_str());
    for (int r = min; r < max; r++) {
        TRIPLERGB **mrxf = (TRIPLERGB **) apply_filter(mrxNoize, h, w, r, sigma);
        psnr = getPSNR((TRIPLEBYTES **) mrx, (TRIPLEBYTES **) mrxf, r, r, h - r, w - r, COMPONENT_Y);
        if (maxPSNR < psnr) {
            maxPSNR = psnr;
            maxRadius = r;
        }
        printf("R = %3d\tPSNR[f,f] = %5.3f\n", r, psnr);
        std::string filename = path + "/radius_";//.bmp";
        save_component_to_files((TRIPLEBYTES **) mrxf, bmFile, bmInfo, COMPONENT_Y,
                                (filename + std::to_string(r) + ".bmp").c_str());
        for (int i = 0; i < h; i++) {
            delete[]mrxf[i];
        }
        delete[] mrxf;
    }
    return maxRadius;
}